

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.hpp
# Opt level: O2

void __thiscall
slang::ast::ConcatenationExpression::serializeTo
          (ConcatenationExpression *this,ASTSerializer *serializer)

{
  pointer ppEVar1;
  size_type sVar2;
  long lVar3;
  string_view name;
  
  if ((this->operands_).size_ != 0) {
    name._M_str = "operands";
    name._M_len = 8;
    ASTSerializer::startArray(serializer,name);
    ppEVar1 = (this->operands_).data_;
    sVar2 = (this->operands_).size_;
    for (lVar3 = 0; sVar2 << 3 != lVar3; lVar3 = lVar3 + 8) {
      ASTSerializer::serialize(serializer,*(Expression **)((long)ppEVar1 + lVar3));
    }
    ASTSerializer::endArray(serializer);
    return;
  }
  return;
}

Assistant:

span_nodiscard span_constexpr bool empty() const span_noexcept
    {
        return size() == 0;
    }